

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

bool __thiscall
wasm::PrintSExpression::maybePrintUnreachableReplacement
          (PrintSExpression *this,Expression *curr,Type type)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  ulong uVar3;
  Id *pIVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 local_90 [8];
  Unreachable unreachable;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  undefined1 local_50 [8];
  Drop drop;
  
  if (type.id == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"(block",6);
    if (this->minify == false) {
      poVar1 = this->o;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ;; (replaces unreachable ",0x1a);
      __s = getExpressionName(curr);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," we can\'t emit)",0xf);
    }
    incIndent(this);
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)local_90,curr);
    uVar3 = ((ulong)((long)local_60 - (long)local_68) >> 3) + CONCAT71(local_90._1_7_,local_90[0]);
    if ((int)uVar3 != 0) {
      drop.value = (Expression *)type.id;
      uVar7 = 0;
      do {
        uVar6 = ((long)local_60 - (long)local_68 >> 3) + CONCAT71(local_90._1_7_,local_90[0]);
        if (uVar6 <= uVar7) {
          __assert_fail("index < children.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/iteration.h"
                        ,0x4a,
                        "Index wasm::AbstractChildIterator<wasm::ChildIterator>::mapIndex(Index) const [Specific = wasm::ChildIterator]"
                       );
        }
        uVar5 = (int)uVar6 + ~(uint)uVar7;
        pIVar4 = (Id *)(local_68 + ((ulong)uVar5 - 4));
        if ((uVar5 & 0xfffffffc) == 0) {
          pIVar4 = &unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression.
                    _id + (ulong)uVar5 * 8;
        }
        drop.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
             **(uintptr_t **)pIVar4;
        local_50[0] = DropId;
        drop.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._id = InvalidId;
        drop.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._1_7_ = 0;
        printFullLine(this,(Expression *)local_50);
        uVar7 = uVar7 + 1;
        type.id = (uintptr_t)drop.value;
      } while (uVar7 != (uVar3 & 0xffffffff));
    }
    if (local_68 != (pointer)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
    local_90[0] = UnreachableId;
    unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression._id = BlockId;
    unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression._1_7_ = 0;
    printFullLine(this,(Expression *)local_90);
    decIndent(this);
  }
  return (Expression *)type.id == (Expression *)0x1;
}

Assistant:

bool PrintSExpression::maybePrintUnreachableReplacement(Expression* curr,
                                                        Type type) {
  // When we cannot print an instruction because the child from which it's
  // supposed to get a type immediate is unreachable, then we print a
  // semantically-equivalent block that drops each of the children and ends in
  // an unreachable.
  if (type != Type::unreachable) {
    return false;
  }

  // Emit a block with drops of the children.
  o << "(block";
  if (!minify) {
    o << " ;; (replaces unreachable " << getExpressionName(curr)
      << " we can't emit)";
  }
  incIndent();
  for (auto* child : ChildIterator(curr)) {
    Drop drop;
    drop.value = child;
    printFullLine(&drop);
  }
  Unreachable unreachable;
  printFullLine(&unreachable);
  decIndent();
  return true;
}